

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O3

void i_string_suite::i_string_invalid_surrogate(void)

{
  char input [14];
  reader reader;
  undefined4 local_17c;
  view_type local_178;
  char local_168 [16];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_168 + 8,"abc\"]",6);
  builtin_strncpy(local_168,"[\"\\ud800",8);
  local_178._M_len = strlen(local_168);
  local_178._M_str = local_168;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_178);
  local_17c = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x114,"void i_string_suite::i_string_invalid_surrogate()",&local_178,&local_17c);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_178._M_len = CONCAT44(local_178._M_len._4_4_,local_158.decoder.current.code);
  local_17c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x116,"void i_string_suite::i_string_invalid_surrogate()",&local_178,&local_17c);
  local_178._M_len =
       (long)local_158.decoder.current.view.tail - (long)local_158.decoder.current.view.head;
  local_178._M_str = local_158.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[12]>
            ("reader.literal()","\"\\\"\\\\ud800abc\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x117,"void i_string_suite::i_string_invalid_surrogate()",&local_178,"\"\\ud800abc\"")
  ;
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_178._M_len = CONCAT44(local_178._M_len._4_4_,local_158.decoder.current.code);
  local_17c = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x119,"void i_string_suite::i_string_invalid_surrogate()",&local_178,&local_17c);
  if (local_158.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void i_string_invalid_surrogate()
{
    const char input[] = "[\"\\ud800abc\"]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "\"\\ud800abc\""); // No knowledge of surrogates
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
}